

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::parseLine(Parser *this)

{
  int iVar1;
  bool bVar2;
  bool local_4f1;
  Token local_4a8;
  allocator local_471;
  string local_470 [32];
  Token local_450;
  Token local_420;
  undefined1 local_3f0 [8];
  AstNode expressionNode;
  Token local_370;
  undefined1 local_340 [8];
  Token nextToken;
  allocator local_2d9;
  string local_2d8 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2b8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2b0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2a8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2a0;
  undefined1 local_298 [8];
  AstNode instructionNode;
  allocator local_211;
  string local_210 [32];
  undefined1 local_1f0 [8];
  Token keywordToken;
  Token local_1b8;
  Token local_188;
  undefined1 local_158 [8];
  AstNode labelNode;
  allocator local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  Token colonToken;
  Token local_70;
  undefined1 local_40 [8];
  Token labelToken;
  Parser *this_local;
  
  labelToken._40_8_ = this;
  peekToken((Token *)local_40,this);
  if (local_40._0_4_ == IdentifierToken) {
    readToken(&local_70,this);
    Token::operator=((Token *)local_40,&local_70);
    Token::~Token(&local_70);
    readToken((Token *)local_b0,this);
    if ((local_b0._0_4_ != DelimiterToken) ||
       (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&colonToken.columnNumber,":"), bVar2)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"colon expected",&local_d1);
      Token::Token((Token *)&labelNode.children.
                             super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(Token *)local_b0);
      parserError(this,(string *)local_d0,
                  (Token *)&labelNode.children.super__Vector_base<AstNode,_std::allocator<AstNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Token::~Token((Token *)&labelNode.children.
                              super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    AstNode::AstNode((AstNode *)local_158,LabelNode);
    std::__cxx11::string::operator=((string *)&labelNode.bValue,(string *)&labelToken.columnNumber);
    std::vector<AstNode,_std::allocator<AstNode>_>::push_back
              (&(this->_ast).rootNode.children,(value_type *)local_158);
    AstNode::~AstNode((AstNode *)local_158);
    Token::~Token((Token *)local_b0);
  }
  peekToken(&local_188,this);
  Token::~Token(&local_188);
  if (local_188.type == LineTerminatorToken) {
    readToken(&local_1b8,this);
    Token::~Token(&local_1b8);
    keywordToken._44_4_ = 1;
  }
  else {
    readToken((Token *)local_1f0,this);
    if (local_1f0._0_4_ != KeywordToken) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"keyword expected",&local_211);
      Token::Token((Token *)&instructionNode.children.
                             super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(Token *)local_1f0);
      parserError(this,(string *)local_210,
                  (Token *)&instructionNode.children.
                            super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      Token::~Token((Token *)&instructionNode.children.
                              super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
    }
    AstNode::AstNode((AstNode *)local_298,NullNode);
    local_2a0._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&this->_directives,(key_type *)&keywordToken.columnNumber);
    local_2a8._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->_directives);
    bVar2 = std::__detail::operator!=(&local_2a0,&local_2a8);
    if (bVar2) {
      local_298._0_4_ = DirectiveNode;
    }
    else {
      local_2b0._M_cur =
           (__node_type *)
           std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&this->_instructions,(key_type *)&keywordToken.columnNumber);
      local_2b8._M_cur =
           (__node_type *)
           std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->_instructions);
      bVar2 = std::__detail::operator!=(&local_2b0,&local_2b8);
      if (bVar2) {
        local_298._0_4_ = InstructionNode;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d8,"unrecognized keyword",&local_2d9);
        Token::Token((Token *)&nextToken.field_0x28,(Token *)local_1f0);
        parserError(this,(string *)local_2d8,(Token *)&nextToken.field_0x28);
        Token::~Token((Token *)&nextToken.field_0x28);
        std::__cxx11::string::~string(local_2d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      }
    }
    std::__cxx11::string::operator=
              ((string *)&instructionNode.bValue,(string *)&keywordToken.columnNumber);
    peekToken((Token *)local_340,this);
    while( true ) {
      local_4f1 = false;
      if (local_340._0_4_ == DelimiterToken) {
        local_4f1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&nextToken.columnNumber,",");
      }
      if (local_4f1 == false) break;
      readToken(&local_370,this);
      Token::~Token(&local_370);
      peekToken((Token *)&expressionNode.children.
                          super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,this);
      iVar1 = (int)expressionNode.children.super__Vector_base<AstNode,_std::allocator<AstNode>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
      Token::~Token((Token *)&expressionNode.children.
                              super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      if (iVar1 != 6) {
        parseExpression((AstNode *)local_3f0,this);
        std::vector<AstNode,_std::allocator<AstNode>_>::push_back
                  ((vector<AstNode,_std::allocator<AstNode>_> *)&instructionNode.field_0x30,
                   (value_type *)local_3f0);
        AstNode::~AstNode((AstNode *)local_3f0);
      }
      peekToken(&local_420,this);
      Token::operator=((Token *)local_340,&local_420);
      Token::~Token(&local_420);
    }
    std::vector<AstNode,_std::allocator<AstNode>_>::push_back
              (&(this->_ast).rootNode.children,(value_type *)local_298);
    readToken(&local_450,this);
    Token::operator=((Token *)local_340,&local_450);
    Token::~Token(&local_450);
    if (local_340._0_4_ != LineTerminatorToken) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_470,"line terminator expected",&local_471);
      Token::Token(&local_4a8,(Token *)local_340);
      parserError(this,(string *)local_470,&local_4a8);
      Token::~Token(&local_4a8);
      std::__cxx11::string::~string(local_470);
      std::allocator<char>::~allocator((allocator<char> *)&local_471);
    }
    Token::~Token((Token *)local_340);
    AstNode::~AstNode((AstNode *)local_298);
    Token::~Token((Token *)local_1f0);
    keywordToken._44_4_ = 0;
  }
  Token::~Token((Token *)local_40);
  return;
}

Assistant:

void Parser::parseLine() {
    Token labelToken = peekToken();

    // Parse label (optional)

    if(labelToken.type == Token::IdentifierToken) {
        labelToken = readToken();
        Token colonToken = readToken();

        if(colonToken.type != Token::DelimiterToken || colonToken.tokenData != ":") {
            parserError("colon expected", colonToken);
        }

        auto labelNode = AstNode{AstNode::LabelNode};
        labelNode.sValue = labelToken.tokenData;
        _ast.rootNode.children.push_back(std::move(labelNode));
    }

    // Parse keyword

    if(peekToken().type == Token::LineTerminatorToken) {
        readToken(); // Line with just label
        return;
    }

    Token keywordToken = readToken();

    if(keywordToken.type != Token::KeywordToken) {
        parserError("keyword expected", keywordToken);
    }

    AstNode instructionNode;
    if(_directives.find(keywordToken.tokenData) != _directives.end()) {
        instructionNode.type = AstNode::DirectiveNode;
    } else if(_instructions.find(keywordToken.tokenData) != _instructions.end()) {
        instructionNode.type = AstNode::InstructionNode;
    } else {
        parserError("unrecognized keyword", keywordToken);
    }

    instructionNode.sValue = keywordToken.tokenData;

    // Parse args

    Token nextToken = peekToken();

    while(nextToken.type == Token::DelimiterToken && nextToken.tokenData == ",") {
        readToken();
        if(peekToken().type != Token::LineTerminatorToken) {
            AstNode expressionNode = parseExpression();
            instructionNode.children.push_back(expressionNode);
        }
        nextToken = peekToken();
    }

    _ast.rootNode.children.push_back(instructionNode);

    nextToken = readToken();
    if(nextToken.type != Token::LineTerminatorToken) {
        parserError("line terminator expected", nextToken);
    }

}